

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdCheck.c
# Opt level: O2

void Dsd_CheckCacheAllocate(int nEntries)

{
  ulong uVar1;
  uint uVar2;
  Dds_Cache_t *pDVar3;
  Dsd_Entry_t *pDVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  pDVar3 = (Dds_Cache_t *)calloc(1,0x18);
  uVar5 = nEntries - 1;
  do {
    do {
      uVar6 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar2 != 0);
    uVar8 = 3;
    do {
      iVar7 = (int)uVar8;
      if (uVar6 < (uint)(iVar7 * iVar7)) {
        pCache = pDVar3;
        pDVar3->nTableSize = uVar6;
        pDVar4 = (Dsd_Entry_t *)malloc((long)(int)uVar6 * 0x28);
        pDVar3->pTable = pDVar4;
        Dsd_CheckCacheClear();
        return;
      }
      uVar1 = (ulong)uVar6 % uVar8;
      uVar8 = (ulong)(iVar7 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

void Dsd_CheckCacheAllocate( int nEntries )
{
    int nRequested;

    pCache = ABC_ALLOC( Dds_Cache_t, 1 );
    memset( pCache, 0, sizeof(Dds_Cache_t) );

    // check what is the size of the current cache
    nRequested = Abc_PrimeCudd( nEntries );
    if ( pCache->nTableSize != nRequested )
    { // the current size is different
        // deallocate the old, allocate the new
        if ( pCache->nTableSize )
            Dsd_CheckCacheDeallocate();
        // allocate memory for the hash table
        pCache->nTableSize = nRequested;
        pCache->pTable = ABC_ALLOC( Dsd_Entry_t, nRequested );
    }
    // otherwise, there is no need to allocate, just clean
    Dsd_CheckCacheClear();
//  printf( "\nThe number of allocated cache entries = %d.\n\n", pCache->nTableSize );
}